

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

bool __thiscall Gaussian::Iterate(Gaussian *this)

{
  char *pcVar1;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *this_00;
  mapped_type *this_01;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvVar2;
  const_reference pvVar3;
  int in_EDX;
  char *in_RSI;
  map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
  *in_RDI;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *v;
  size_t idx;
  Gaussian *in_stack_ffffffffffffffd0;
  map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
  *this_02;
  bool local_1;
  
  this_02 = in_RDI;
  pcVar1 = index((Gaussian *)in_RDI,in_RSI,in_EDX);
  this_00 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
            ((long)(int)pcVar1 + 1);
  am(in_stack_ffffffffffffffd0);
  this_01 = std::
            map<int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>_>
            ::at(this_02,(key_type *)this_00);
  pvVar2 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
           std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size(this_01);
  if (this_00 < pvVar2) {
    pvVar3 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::at
                       (this_00,(size_type)in_RDI);
    *(undefined8 *)in_RDI = *(undefined8 *)pvVar3->_M_elems;
    *(int *)(in_RDI + 8) = pvVar3->_M_elems[2];
    local_1 = operator_cast_to_bool((Gaussian *)this_00);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Iterate(void)
    {
        size_t idx = static_cast<size_t>(index()) + 1;
        const auto & v = gorder_map.at(am());

        if(idx >= v.size())
            return false;
        else
        {
            ijk = v.at(idx);
            return *this;
        }
    }